

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<16U,_12U,_buffer_layout_bfs>::operator()
          (fill<16U,_12U,_buffer_layout_bfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  size_t sVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  array<unsigned_long,_16UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_16UL> *streams_local;
  fill<16U,_12U,_buffer_layout_bfs> *this_local;
  long local_38;
  size_t n_1;
  size_t n;
  size_t empty;
  
  pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xc);
  if (*pvVar6 != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 16U, I = 12U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
  sVar1 = pvVar7->n;
  pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
  if (sVar1 + pvVar7->n < 8) {
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
    sVar1 = pvVar7->n;
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
    lVar8 = (8 - sVar1) - pvVar7->n;
    n_1 = 8;
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
    sVar1 = n_1;
    if (pvVar7->n == 0) {
LAB_0015b74d:
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x138 - n_1));
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xc);
      *pvVar6 = 8 - lVar8;
    }
    else {
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      if (pvVar7->n != 0) {
        do {
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            buffer[lVar8 + (0x138 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) goto LAB_0015b74d;
          }
          else {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            buffer[lVar8 + (0x138 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) break;
          }
          n_1 = n_1 - 1;
        } while( true );
      }
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x138 - n_1));
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xc);
      *pvVar6 = 8 - lVar8;
      check_input(buffer + lVar8 + 0x130,8 - lVar8);
    }
  }
  else {
    local_38 = 8;
    pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
    lVar8 = local_38;
    if (pvVar7->n == 0) {
LAB_0015bac7:
      local_38 = lVar8;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,pvVar7->stream + local_38,buffer + (0x138 - local_38));
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      pvVar7->n = pvVar7->n - local_38;
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      pvVar7->stream = pvVar7->stream + local_38;
      pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xc);
      *pvVar6 = 8;
      check_input(buffer + 0x130,8);
    }
    else {
      pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
      if (pvVar7->n == 0) {
LAB_0015bba7:
        local_38 = lVar8;
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
        ppuVar4 = pvVar7->stream;
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
        std::copy<unsigned_char**,unsigned_char**>
                  (ppuVar4,pvVar7->stream + local_38,buffer + (0x138 - local_38));
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
        pvVar7->n = pvVar7->n - local_38;
        pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
        pvVar7->stream = pvVar7->stream + local_38;
        pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xc);
        *pvVar6 = 8;
        check_input(buffer + 0x130,8);
      }
      else {
        for (; local_38 != 0; local_38 = local_38 + -1) {
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            buffer[0x138 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,8);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0015bac7;
          }
          else {
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            buffer[0x138 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_16UL>::operator[](streams,9);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0015bba7;
          }
        }
        pvVar6 = std::array<unsigned_long,_16UL>::operator[](buffer_count,0xc);
        *pvVar6 = 8;
        check_input(buffer + 0x130,8);
      }
    }
  }
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}